

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interprocedural.cpp
# Opt level: O0

void __thiscall
dg::pta::LLVMPointerGraphBuilder::addArgumentOperands
          (LLVMPointerGraphBuilder *this,Function *F,PSNode *arg,uint idx)

{
  bool bVar1;
  const_use_iterator CI_00;
  const_use_iterator arg_00;
  Use *this_00;
  User *this_01;
  Function *pFVar2;
  undefined4 in_ECX;
  Function *in_RSI;
  Value *in_RDI;
  CallInst *CI;
  Value *use;
  const_use_iterator E;
  const_use_iterator I;
  ret_type in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffe0;
  
  CI_00 = llvm::Value::use_begin(in_RDI);
  arg_00 = llvm::Value::use_end(in_RDI);
  while( true ) {
    bVar1 = llvm::Value::use_iterator_impl<const_llvm::Use>::operator!=
                      ((use_iterator_impl<const_llvm::Use> *)in_stack_ffffffffffffffc0,
                       (use_iterator_impl<const_llvm::Use> *)in_RDI);
    if (!bVar1) break;
    this_00 = llvm::Value::use_iterator_impl<const_llvm::Use>::operator->
                        ((use_iterator_impl<const_llvm::Use> *)0x1b1c7d);
    this_01 = llvm::Use::getUser(this_00);
    in_stack_ffffffffffffffc0 =
         llvm::dyn_cast<llvm::CallInst,llvm::Value_const>((Value *)in_stack_ffffffffffffffc0);
    if (in_stack_ffffffffffffffc0 != (ret_type)0x0) {
      pFVar2 = llvm::CallBase::getCalledFunction((CallBase *)this_01);
      if (pFVar2 == in_RSI) {
        addArgumentOperands((LLVMPointerGraphBuilder *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                            (CallInst *)CI_00.U,(PSNode *)arg_00.U,(uint)((ulong)this_01 >> 0x20));
      }
    }
    llvm::Value::use_iterator_impl<const_llvm::Use>::operator++
              ((use_iterator_impl<const_llvm::Use> *)in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

void LLVMPointerGraphBuilder::addArgumentOperands(const llvm::Function *F,
                                                  PSNode *arg, unsigned idx) {
    using namespace llvm;

    for (auto I = F->use_begin(), E = F->use_end(); I != E; ++I) {
#if ((LLVM_VERSION_MAJOR == 3) && (LLVM_VERSION_MINOR < 5))
        const Value *use = *I;
#else
        const Value *use = I->getUser();
#endif
        const CallInst *CI = dyn_cast<CallInst>(use);
        if (CI && CI->getCalledFunction() == F)
            addArgumentOperands(CI, arg, idx);
    }
}